

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qc_socket.c
# Opt level: O1

int qc_tcp_recv(QcSocket *socket,char *recvbuf,int len)

{
  int iVar1;
  ssize_t sVar2;
  
  sVar2 = recv(socket->sockfd,recvbuf,(long)len,0x4000);
  iVar1 = (int)sVar2;
  if (iVar1 < 0) {
    _qc_error("/workspace/llm4binary/github/license_all_cmakelists_1510/zhanglw-dev[P]queue-c/src/qc_rt/qc_socket.c"
              ,0xe7,"tcp recv failed");
    iVar1 = -1;
  }
  return iVar1;
}

Assistant:

int qc_tcp_recv(QcSocket *socket, char *recvbuf, int len)
{
    int bytes;

    bytes = (int)recv(socket->sockfd, recvbuf, len, MSG_NOSIGNAL);
    if(bytes < 0)
    {
        qc_error("tcp recv failed");
        return -1;
    }
    else if(0 == bytes)
        return 0;  /*Connection closed*/

    return bytes;
}